

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemplatedCustomNamer.cpp
# Opt level: O1

Path * __thiscall
ApprovalTests::TemplatedCustomNamer::constructFromTemplate
          (Path *__return_storage_ptr__,TemplatedCustomNamer *this,string *extensionWithDot,
          string *approvedOrReceivedReplacement)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  string result;
  string local_320;
  string local_300;
  string *local_2e0;
  _Any_data local_2d8;
  code *local_2c8;
  code *pcStack_2c0;
  _Any_data local_2b8;
  code *local_2a8;
  code *pcStack_2a0;
  _Any_data local_298;
  code *local_288;
  code *pcStack_280;
  _Any_data local_278;
  code *local_268;
  code *pcStack_260;
  _Any_data local_258;
  code *local_248;
  code *pcStack_240;
  _Any_data local_238;
  code *local_228;
  code *pcStack_220;
  _Any_data local_218;
  code *local_208;
  code *pcStack_200;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
  pcVar2 = (this->template_)._M_dataplus._M_p;
  local_2e0 = approvedOrReceivedReplacement;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_320,pcVar2,pcVar2 + (this->template_)._M_string_length);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,local_320._M_dataplus._M_p,
             local_320._M_dataplus._M_p + local_320._M_string_length);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"{FileExtension}","");
  local_218._8_8_ = 0;
  pcStack_200 = ::std::
                _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/namers/TemplatedCustomNamer.cpp:55:59)>
                ::_M_invoke;
  local_208 = ::std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/namers/TemplatedCustomNamer.cpp:55:59)>
              ::_M_manager;
  local_218._M_unused._M_object = extensionWithDot;
  anon_unknown.dwarf_42a7ed::replaceIfContains
            (&local_300,&local_50,&local_70,
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
              *)&local_218);
  ::std::__cxx11::string::operator=((string *)&local_320,(string *)&local_300);
  paVar1 = &local_300.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != paVar1) {
    operator_delete(local_300._M_dataplus._M_p);
  }
  if (local_208 != (code *)0x0) {
    (*local_208)(&local_218,&local_218,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,local_320._M_dataplus._M_p,
             local_320._M_dataplus._M_p + local_320._M_string_length);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,"{ApprovalsSubdirectory}","");
  local_238._8_8_ = 0;
  pcStack_220 = ::std::
                _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/namers/TemplatedCustomNamer.cpp:56:67)>
                ::_M_invoke;
  local_228 = ::std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/namers/TemplatedCustomNamer.cpp:56:67)>
              ::_M_manager;
  local_238._M_unused._M_object = this;
  anon_unknown.dwarf_42a7ed::replaceIfContains
            (&local_300,&local_90,&local_b0,
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
              *)&local_238);
  ::std::__cxx11::string::operator=((string *)&local_320,(string *)&local_300);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != paVar1) {
    operator_delete(local_300._M_dataplus._M_p);
  }
  if (local_228 != (code *)0x0) {
    (*local_228)(&local_238,&local_238,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,local_320._M_dataplus._M_p,
             local_320._M_dataplus._M_p + local_320._M_string_length);
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f0,"{RelativeTestSourceDirectory}","");
  local_258._8_8_ = 0;
  pcStack_240 = ::std::
                _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/namers/TemplatedCustomNamer.cpp:57:73)>
                ::_M_invoke;
  local_248 = ::std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/namers/TemplatedCustomNamer.cpp:57:73)>
              ::_M_manager;
  local_258._M_unused._M_object = this;
  anon_unknown.dwarf_42a7ed::replaceIfContains
            (&local_300,&local_d0,&local_f0,
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
              *)&local_258);
  ::std::__cxx11::string::operator=((string *)&local_320,(string *)&local_300);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != paVar1) {
    operator_delete(local_300._M_dataplus._M_p);
  }
  if (local_248 != (code *)0x0) {
    (*local_248)(&local_258,&local_258,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_110,local_320._M_dataplus._M_p,
             local_320._M_dataplus._M_p + local_320._M_string_length);
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"{TestFileName}","");
  local_278._8_8_ = 0;
  pcStack_260 = ::std::
                _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/namers/TemplatedCustomNamer.cpp:58:58)>
                ::_M_invoke;
  local_268 = ::std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/namers/TemplatedCustomNamer.cpp:58:58)>
              ::_M_manager;
  local_278._M_unused._M_object = this;
  anon_unknown.dwarf_42a7ed::replaceIfContains
            (&local_300,&local_110,&local_130,
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
              *)&local_278);
  ::std::__cxx11::string::operator=((string *)&local_320,(string *)&local_300);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != paVar1) {
    operator_delete(local_300._M_dataplus._M_p);
  }
  if (local_268 != (code *)0x0) {
    (*local_268)(&local_278,&local_278,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_150,local_320._M_dataplus._M_p,
             local_320._M_dataplus._M_p + local_320._M_string_length);
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"{TestCaseName}","");
  local_298._8_8_ = 0;
  pcStack_280 = ::std::
                _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/namers/TemplatedCustomNamer.cpp:59:58)>
                ::_M_invoke;
  local_288 = ::std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/namers/TemplatedCustomNamer.cpp:59:58)>
              ::_M_manager;
  local_298._M_unused._M_object = this;
  anon_unknown.dwarf_42a7ed::replaceIfContains
            (&local_300,&local_150,&local_170,
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
              *)&local_298);
  ::std::__cxx11::string::operator=((string *)&local_320,(string *)&local_300);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != paVar1) {
    operator_delete(local_300._M_dataplus._M_p);
  }
  if (local_288 != (code *)0x0) {
    (*local_288)(&local_298,&local_298,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,local_320._M_dataplus._M_p,
             local_320._M_dataplus._M_p + local_320._M_string_length);
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"{TestSourceDirectory}","")
  ;
  local_2b8._8_8_ = 0;
  pcStack_2a0 = ::std::
                _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/namers/TemplatedCustomNamer.cpp:60:65)>
                ::_M_invoke;
  local_2a8 = ::std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/namers/TemplatedCustomNamer.cpp:60:65)>
              ::_M_manager;
  local_2b8._M_unused._M_object = this;
  anon_unknown.dwarf_42a7ed::replaceIfContains
            (&local_300,&local_190,&local_1b0,
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
              *)&local_2b8);
  ::std::__cxx11::string::operator=((string *)&local_320,(string *)&local_300);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != paVar1) {
    operator_delete(local_300._M_dataplus._M_p);
  }
  if (local_2a8 != (code *)0x0) {
    (*local_2a8)(&local_2b8,&local_2b8,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p);
  }
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d0,local_320._M_dataplus._M_p,
             local_320._M_dataplus._M_p + local_320._M_string_length);
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"{ApprovedOrReceived}","");
  local_2d8._8_8_ = 0;
  local_2d8._M_unused._M_object = local_2e0;
  pcStack_2c0 = ::std::
                _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/namers/TemplatedCustomNamer.cpp:61:64)>
                ::_M_invoke;
  local_2c8 = ::std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/namers/TemplatedCustomNamer.cpp:61:64)>
              ::_M_manager;
  anon_unknown.dwarf_42a7ed::replaceIfContains
            (&local_300,&local_1d0,&local_1f0,
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
              *)&local_2d8);
  ::std::__cxx11::string::operator=((string *)&local_320,(string *)&local_300);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != paVar1) {
    operator_delete(local_300._M_dataplus._M_p);
  }
  if (local_2c8 != (code *)0x0) {
    (*local_2c8)(&local_2d8,&local_2d8,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  Path::Path(__return_storage_ptr__,&local_320);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != &local_320.field_2) {
    operator_delete(local_320._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

Path TemplatedCustomNamer::constructFromTemplate(
        const std::string& extensionWithDot,
        const std::string& approvedOrReceivedReplacement) const
    {
        std::string result = template_;
        // begin-snippet: custom_namer_tags
        auto testSourceDirectory = "{TestSourceDirectory}";
        auto relativeTestSourceDirectory = "{RelativeTestSourceDirectory}";
        auto approvalsSubdirectory = "{ApprovalsSubdirectory}";
        auto testFileName = "{TestFileName}";
        auto testCaseName = "{TestCaseName}";
        auto approvedOrReceived = "{ApprovedOrReceived}";
        auto fileExtension = "{FileExtension}";
        // end-snippet

        using namespace ApprovalTests;

        // clang-format off
        result = replaceIfContains(result, fileExtension, [&](){return extensionWithDot.substr(1);});
        result = replaceIfContains(result, approvalsSubdirectory, [&](){return namer_.getApprovalsSubdirectory();});
        result = replaceIfContains(result, relativeTestSourceDirectory, [&](){return namer_.getRelativeTestSourceDirectory();});
        result = replaceIfContains(result, testFileName, [&](){return namer_.getSourceFileName();});
        result = replaceIfContains(result, testCaseName, [&](){return namer_.getTestName();});
        result = replaceIfContains(result, testSourceDirectory, [&](){return namer_.getTestSourceDirectory();});
        result = replaceIfContains(result, approvedOrReceived, [&](){return approvedOrReceivedReplacement;});
        // clang-format on

        // Convert to native directory separators:
        return Path(result);
    }